

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O1

void __thiscall IndividualBeliefJESP::~IndividualBeliefJESP(IndividualBeliefJESP *this,void **vtt)

{
  void *pvVar1;
  pointer puVar2;
  pointer puVar3;
  
  pvVar1 = *vtt;
  *(void **)&this->super_Belief = pvVar1;
  *(void **)(&(this->super_Belief).field_0x0 + *(long *)((long)pvVar1 + -0xb8)) = vtt[3];
  if (this->_m_stepsizeJOHOH != (size_t *)0x0) {
    operator_delete__(this->_m_stepsizeJOHOH);
  }
  if (this->_m_stepsizeSJOH != (size_t *)0x0) {
    operator_delete__(this->_m_stepsizeSJOH);
  }
  puVar2 = (this->_m_sizeVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->_m_sizeVec).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  puVar2 = (this->_m_nrOH_others).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->_m_nrOH_others).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  puVar3 = (this->_m_others).super_SDT.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->_m_others).super_SDT.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  Belief::~Belief(&this->super_Belief,vtt + 1);
  return;
}

Assistant:

IndividualBeliefJESP::~IndividualBeliefJESP()
{
    delete [] _m_stepsizeJOHOH;
    delete [] _m_stepsizeSJOH;
}